

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

size_t __thiscall slang::ast::Type::hash(Type *this)

{
  SymbolKind SVar1;
  int iVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  Type *pTVar5;
  size_t sVar6;
  int iVar7;
  SymbolKind SVar8;
  QueueType *qt;
  size_t h;
  InstanceSymbol *local_20;
  
  h = (size_t)(int)(this->super_Symbol).kind;
  pTVar5 = getCanonicalType(this);
  bVar4 = isScalar(pTVar5);
  if (bVar4) {
    iVar2 = (int)pTVar5[1].super_Symbol.name._M_len;
    iVar7 = 1;
    if (iVar2 != 2) {
      iVar7 = iVar2;
    }
    local_20 = (InstanceSymbol *)CONCAT44(local_20._4_4_,iVar7);
    hash_combine<slang::ast::ScalarType::Kind>(&h,(Kind *)&local_20);
    return h;
  }
  bVar4 = isFloating(pTVar5);
  if (bVar4) {
    SVar1 = pTVar5[1].super_Symbol.kind;
    SVar8 = Unknown;
    if (SVar1 != Definition) {
      SVar8 = SVar1;
    }
    local_20 = (InstanceSymbol *)CONCAT44(local_20._4_4_,SVar8);
    hash_combine<slang::ast::FloatingType::Kind>(&h,(Kind *)&local_20);
    return h;
  }
  bVar4 = isIntegral(pTVar5);
  if (bVar4) {
    hash_combine<bool,bool,unsigned_int>
              (&h,(bool *)&pTVar5[1].super_Symbol.field_0x4,(bool)pTVar5[1].super_Symbol.field_0x5,
               pTVar5[1].super_Symbol.kind);
    return h;
  }
  SVar1 = (pTVar5->super_Symbol).kind;
  switch(SVar1) {
  case FixedSizeUnpackedArrayType:
    iVar2 = *(int *)((long)&pTVar5[1].super_Symbol.name._M_len + 4);
    sVar6 = hash(*(Type **)&pTVar5[1].super_Symbol);
    hash_combine<int,int,unsigned_long>(&h,(int *)&pTVar5[1].super_Symbol.name,iVar2,sVar6);
    break;
  case DynamicArrayType:
    pTVar5 = *(Type **)&pTVar5[1].super_Symbol;
    goto LAB_00353d9a;
  case DPIOpenArrayType:
    sVar6 = hash(*(Type **)&pTVar5[1].super_Symbol);
    hash_combine<bool,unsigned_long>(&h,(bool *)&pTVar5[1].super_Symbol.name,sVar6);
    break;
  case AssociativeArrayType:
    local_20 = (InstanceSymbol *)hash(*(Type **)&pTVar5[1].super_Symbol);
    hash_combine<unsigned_long>(&h,(unsigned_long *)&local_20);
    pTVar5 = (Type *)pTVar5[1].super_Symbol.name._M_len;
    if (pTVar5 == (Type *)0x0) {
      return h;
    }
LAB_00353d9a:
    local_20 = (InstanceSymbol *)hash(pTVar5);
    hash_combine<unsigned_long>(&h,(unsigned_long *)&local_20);
    break;
  case QueueType:
    local_20 = (InstanceSymbol *)hash(*(Type **)&pTVar5[1].super_Symbol);
    hash_combine<unsigned_long,unsigned_int>
              (&h,(unsigned_long *)&local_20,(uint)pTVar5[1].super_Symbol.name._M_len);
    break;
  default:
    if (SVar1 == VirtualInterfaceType) {
      local_20 = *(InstanceSymbol **)&pTVar5[1].super_Symbol;
      hash_combine<slang::ast::InstanceSymbol_const*>(&h,&local_20);
      hash_combine<slang::ast::ModportSymbol_const*>
                (&h,(ModportSymbol **)&pTVar5[1].super_Symbol.name);
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = pTVar5;
      h = SUB168(auVar3 * ZEXT816(0x9e3779b97f4a7c15),8) ^
          SUB168(auVar3 * ZEXT816(0x9e3779b97f4a7c15),0);
    }
  }
  return h;
}

Assistant:

size_t Type::hash() const {
    size_t h = size_t(kind);
    auto& ct = getCanonicalType();
    if (ct.isScalar()) {
        auto sk = ct.as<ScalarType>().scalarKind;
        if (sk == ScalarType::Reg)
            sk = ScalarType::Logic;
        hash_combine(h, sk);
    }
    else if (ct.isFloating()) {
        auto fk = ct.as<FloatingType>().floatKind;
        if (fk == FloatingType::RealTime)
            fk = FloatingType::Real;
        hash_combine(h, fk);
    }
    else if (ct.isIntegral()) {
        auto& it = ct.as<IntegralType>();
        hash_combine(h, it.isSigned, it.isFourState, it.bitWidth);
    }
    else if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
        auto& uat = ct.as<FixedSizeUnpackedArrayType>();
        hash_combine(h, uat.range.left, uat.range.right, uat.elementType.hash());
    }
    else if (ct.kind == SymbolKind::DynamicArrayType) {
        auto& dat = ct.as<DynamicArrayType>();
        hash_combine(h, dat.elementType.hash());
    }
    else if (ct.kind == SymbolKind::DPIOpenArrayType) {
        auto& dat = ct.as<DPIOpenArrayType>();
        hash_combine(h, dat.isPacked, dat.elementType.hash());
    }
    else if (ct.kind == SymbolKind::AssociativeArrayType) {
        auto& aat = ct.as<AssociativeArrayType>();
        hash_combine(h, aat.elementType.hash());
        if (aat.indexType)
            hash_combine(h, aat.indexType->hash());
    }
    else if (ct.kind == SymbolKind::QueueType) {
        auto& qt = ct.as<QueueType>();
        hash_combine(h, qt.elementType.hash(), qt.maxBound);
    }
    else if (ct.kind == SymbolKind::VirtualInterfaceType) {
        auto& vi = ct.as<VirtualInterfaceType>();
        hash_combine(h, &vi.iface);
        hash_combine(h, vi.modport);
    }
    else {
        h = (size_t)slang::hash<const Type*>()(&ct);
    }
    return h;
}